

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void __thiscall libtorrent::aux::torrent::peer_is_interesting(torrent *this,peer_connection *c)

{
  bool bVar1;
  int iVar2;
  vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
  *pvVar3;
  
  iVar2 = (*(c->super_bandwidth_socket)._vptr_bandwidth_socket[0x1b])(c);
  if ((char)iVar2 != '\0') {
    return;
  }
  peer_connection::send_interested(c);
  if ((*(short *)&c->field_0x885 < 0) &&
     (pvVar3 = peer_connection::allowed_fast(c),
     (pvVar3->
     super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
     )._M_impl.super__Vector_impl_data._M_start ==
     (pvVar3->
     super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
     )._M_impl.super__Vector_impl_data._M_finish)) {
    return;
  }
  bVar1 = request_a_block(this,c);
  if (bVar1) {
    inc_stats_counter(this,0x21,1);
  }
  peer_connection::send_block_requests(c);
  return;
}

Assistant:

void torrent::peer_is_interesting(peer_connection& c)
	{
		INVARIANT_CHECK;

		// no peer should be interesting if we're finished
		TORRENT_ASSERT(!is_finished());

		if (c.in_handshake()) return;
		c.send_interested();
		if (c.has_peer_choked()
			&& c.allowed_fast().empty())
			return;

		if (request_a_block(*this, c))
			inc_stats_counter(counters::interesting_piece_picks);
		c.send_block_requests();
	}